

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pax_filename_encoding.c
# Opt level: O0

void test_pax_filename_encoding(void)

{
  test_pax_filename_encoding_1();
  test_pax_filename_encoding_2();
  test_pax_filename_encoding_3();
  return;
}

Assistant:

DEFINE_TEST(test_pax_filename_encoding)
{
	test_pax_filename_encoding_1();
	test_pax_filename_encoding_2();
	test_pax_filename_encoding_3();
}